

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

uint Extra_TruthPermute(uint Truth,char *pPerms,int nVars,int fReverse)

{
  int *pMints;
  int *pMintsP;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (5 < nVars) {
    __assert_fail("nVars < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                  ,0x168,"unsigned int Extra_TruthPermute(unsigned int, char *, int, int)");
  }
  uVar3 = 1 << ((byte)nVars & 0x1f);
  uVar4 = (ulong)uVar3;
  pMints = (int *)malloc(uVar4 * 4);
  pMintsP = (int *)malloc(uVar4 * 4);
  uVar1 = 0;
  do {
    pMints[uVar1] = (int)uVar1;
    uVar1 = uVar1 + 1;
  } while (uVar4 != uVar1);
  Extra_TruthPermute_int(pMints,uVar3,pPerms,nVars,pMintsP);
  if (fReverse == 0) {
    uVar1 = 0;
    uVar3 = 0;
    do {
      if ((Truth >> ((uint)uVar1 & 0x1f) & 1) != 0) {
        uVar3 = uVar3 | 1 << (*(byte *)(pMintsP + uVar1) & 0x1f);
      }
      uVar1 = uVar1 + 1;
    } while (uVar4 != uVar1);
  }
  else {
    uVar1 = 0;
    uVar3 = 0;
    do {
      uVar2 = 1 << ((byte)uVar1 & 0x1f);
      if ((Truth >> (pMintsP[uVar1] & 0x1fU) & 1) == 0) {
        uVar2 = 0;
      }
      uVar3 = uVar3 | uVar2;
      uVar1 = uVar1 + 1;
    } while (uVar4 != uVar1);
  }
  if (pMints != (int *)0x0) {
    free(pMints);
  }
  if (pMintsP != (int *)0x0) {
    free(pMintsP);
  }
  return uVar3;
}

Assistant:

unsigned Extra_TruthPermute( unsigned Truth, char * pPerms, int nVars, int fReverse )
{
    unsigned Result;
    int * pMints;
    int * pMintsP;
    int nMints;
    int i, m;

    assert( nVars < 6 );
    nMints  = (1 << nVars);
    pMints  = ABC_ALLOC( int, nMints );
    pMintsP = ABC_ALLOC( int, nMints );
    for ( i = 0; i < nMints; i++ )
        pMints[i] = i;

    Extra_TruthPermute_int( pMints, nMints, pPerms, nVars, pMintsP );

    Result = 0;
    if ( fReverse )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Truth & (1 << pMintsP[m]) )
                Result |= (1 << m);
    }
    else
    {
        for ( m = 0; m < nMints; m++ )
            if ( Truth & (1 << m) )
                Result |= (1 << pMintsP[m]);
    }

    ABC_FREE( pMints );
    ABC_FREE( pMintsP );

    return Result;
}